

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenRefCount.cpp
# Opt level: O1

TokenRef * antlr::TokenRef::getRef(Token *p)

{
  TokenRef *pTVar1;
  
  if (p != (Token *)0x0) {
    pTVar1 = p->ref;
    if (pTVar1 == (TokenRef *)0x0) {
      pTVar1 = (TokenRef *)operator_new(0x10);
      pTVar1->ptr = p;
      pTVar1->count = 1;
      p->ref = pTVar1;
    }
    else {
      pTVar1->count = pTVar1->count + 1;
    }
    return pTVar1;
  }
  return (TokenRef *)0x0;
}

Assistant:

TokenRef* TokenRef::getRef(const Token* p)
{
	if (p) {
		Token* pp = const_cast<Token*>(p);
		if (pp->ref)
			return pp->ref->increment();
		else
			return new TokenRef(pp);
	} else
		return 0;
}